

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::M3DImporter::populateMesh
          (M3DImporter *this,M3DWrapper *m3d,aiMesh *pMesh,
          vector<aiFace,_std::allocator<aiFace>_> *faces,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *texcoords,
          vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vertexids)

{
  uint *puVar1;
  pointer paVar2;
  pointer __src;
  m3dv_t *pmVar3;
  m3ds_t *pmVar4;
  M3DImporter *this_00;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  aiFace *__result;
  aiVector3D *paVar9;
  aiColor4D *__s;
  aiBone **ppaVar10;
  aiBone *paVar11;
  aiNode *paVar12;
  pointer puVar13;
  reference pvVar14;
  aiVertexWeight *__s_00;
  aiFace *paVar15;
  pointer puVar16;
  uint uVar17;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar18;
  uint k;
  Logger *pLVar19;
  uint i;
  size_t sVar20;
  ulong uVar21;
  allocator<char> local_889;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_888;
  Logger *local_880;
  ulong local_878;
  char *local_870;
  ulong local_868;
  ulong local_850;
  ulong local_848;
  M3DImporter *local_840;
  aiString name;
  aiString local_434;
  
  local_840 = this;
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("pMesh != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29c,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (faces == (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
    __assert_fail("faces != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29d,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertices == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("vertices != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29e,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (normals == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("normals != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29f,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (texcoords == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("texcoords != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a0,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (colors == (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0) {
    __assert_fail("colors != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a1,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertexids == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    __assert_fail("vertexids != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a2,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  local_888 = normals;
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a3,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  local_880 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[31]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
             (char (*) [31])"M3D: populateMesh numvertices ");
  std::ostream::_M_insert<unsigned_long>((ulong)&name);
  std::operator<<((ostream *)&name," numfaces ");
  std::ostream::_M_insert<unsigned_long>((ulong)&name);
  std::operator<<((ostream *)&name," numnormals ");
  std::ostream::_M_insert<unsigned_long>((ulong)&name);
  std::operator<<((ostream *)&name," numtexcoord ");
  std::ostream::_M_insert<unsigned_long>((ulong)&name);
  std::operator<<((ostream *)&name," numbones ");
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&name,
             &m3d->m3d_->numbone);
  std::__cxx11::stringbuf::str();
  Logger::debug(local_880,local_870);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  if (((vertices->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish !=
       (vertices->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start) &&
     (lVar6 = (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                    super__Vector_impl_data._M_start, lVar6 != 0)) {
    uVar7 = lVar6 >> 4;
    pMesh->mNumFaces = (uint)uVar7;
    uVar7 = uVar7 & 0xffffffff;
    local_880 = (Logger *)m3d;
    puVar8 = (ulong *)operator_new__(uVar7 * 0x10 + 8);
    *puVar8 = uVar7;
    __result = (aiFace *)(puVar8 + 1);
    if (uVar7 != 0) {
      paVar15 = __result;
      do {
        paVar15->mNumIndices = 0;
        paVar15->mIndices = (uint *)0x0;
        paVar15 = paVar15 + 1;
      } while (paVar15 != __result + uVar7);
    }
    pMesh->mFaces = __result;
    std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<aiFace*,aiFace*>
              ((faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
               super__Vector_impl_data._M_finish,__result);
    local_878 = ((long)(vertices->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(vertices->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0xc;
    pMesh->mNumVertices = (uint)local_878;
    uVar21 = local_878 & 0xffffffff;
    uVar7 = uVar21 * 0xc;
    paVar9 = (aiVector3D *)operator_new__(uVar7);
    local_848 = uVar21;
    if (uVar21 != 0) {
      memset(paVar9,0,((uVar7 - 0xc) - (uVar7 - 0xc) % 0xc) + 0xc);
    }
    pLVar19 = local_880;
    pMesh->mVertices = paVar9;
    paVar2 = (vertices->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar20 = (long)(vertices->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
    local_850 = uVar7;
    if (sVar20 != 0) {
      memmove(paVar9,paVar2,sVar20);
    }
    uVar7 = local_850;
    if ((long)(local_888->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_888->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start == sVar20) {
      paVar9 = (aiVector3D *)operator_new__(local_850);
      if ((int)local_878 != 0) {
        memset(paVar9,0,((uVar7 - 0xc) - (uVar7 - 0xc) % 0xc) + 0xc);
      }
      pMesh->mNormals = paVar9;
      paVar2 = (local_888->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar20 = (long)(local_888->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
      if (sVar20 != 0) {
        memmove(paVar9,paVar2,sVar20);
      }
    }
    uVar21 = local_848;
    uVar7 = local_850;
    lVar6 = (long)(vertices->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(vertices->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if ((long)(texcoords->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(texcoords->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start == lVar6) {
      paVar9 = (aiVector3D *)operator_new__(local_850);
      if ((int)local_878 != 0) {
        memset(paVar9,0,((uVar7 - 0xc) - (uVar7 - 0xc) % 0xc) + 0xc);
      }
      pMesh->mTextureCoords[0] = paVar9;
      paVar2 = (texcoords->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar20 = (long)(texcoords->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
      if (sVar20 != 0) {
        memmove(paVar9,paVar2,sVar20);
      }
      pMesh->mNumUVComponents[0] = 2;
      lVar6 = (long)(vertices->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(vertices->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    }
    if ((long)(colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 4 == lVar6 / 0xc) {
      __s = (aiColor4D *)operator_new__(uVar21 << 4);
      if ((int)local_878 != 0) {
        memset(__s,0,uVar21 << 4);
      }
      pMesh->mColors[0] = __s;
      __src = (colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
      sVar20 = (long)(colors->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)__src;
      if (sVar20 != 0) {
        memmove(__s,__src,sVar20);
      }
    }
    uVar17 = ((m3d_t *)pLVar19->_vptr_Logger)->numbone;
    pMesh->mNumBones = uVar17;
    if ((ulong)uVar17 != 0) {
      ppaVar10 = (aiBone **)operator_new__((ulong)uVar17 << 3);
      pMesh->mBones = ppaVar10;
      pvVar18 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x1;
      for (uVar7 = 0; uVar7 < ((M3DWrapper *)pLVar19)->m3d_->numbone; uVar7 = uVar7 + 1) {
        paVar11 = (aiBone *)operator_new(0x460);
        aiBone::aiBone(paVar11);
        pMesh->mBones[uVar7] = paVar11;
        local_888 = pvVar18;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_870,
                   *(char **)(((M3DWrapper *)pLVar19)->m3d_->bone->mat4 + (long)pvVar18 * 2 + -10),
                   &local_889);
        sVar20 = local_868 & 0xffffffff;
        if ((local_868 & 0xfffffc00) != 0) {
          sVar20 = 0x3ff;
        }
        name.length = (ai_uint32)sVar20;
        memcpy(name.data,local_870,sVar20);
        name.data[sVar20] = '\0';
        paVar11 = pMesh->mBones[uVar7];
        (paVar11->mName).length = (ai_uint32)sVar20;
        memcpy((paVar11->mName).data,name.data,sVar20);
        (paVar11->mName).data[sVar20] = '\0';
        std::__cxx11::string::~string((string *)&local_870);
        this_00 = local_840;
        pMesh->mBones[uVar7]->mNumWeights = 0;
        paVar12 = local_840->mScene->mRootNode;
        uVar17 = (pMesh->mBones[uVar7]->mName).length;
        sVar20 = (size_t)uVar17;
        if (0x3fe < uVar17) {
          sVar20 = 0x3ff;
        }
        local_434.length = (ai_uint32)sVar20;
        memcpy(local_434.data,(pMesh->mBones[uVar7]->mName).data,sVar20);
        local_434.data[sVar20] = '\0';
        paVar12 = findNode(this_00,paVar12,&local_434);
        paVar11 = pMesh->mBones[uVar7];
        if (paVar12 == (aiNode *)0x0) {
          (paVar11->mOffsetMatrix).a1 = 1.0;
          (paVar11->mOffsetMatrix).a2 = 0.0;
          (paVar11->mOffsetMatrix).a3 = 0.0;
          (paVar11->mOffsetMatrix).a4 = 0.0;
          (paVar11->mOffsetMatrix).b1 = 0.0;
          (paVar11->mOffsetMatrix).b2 = 1.0;
          (paVar11->mOffsetMatrix).b3 = 0.0;
          (paVar11->mOffsetMatrix).b4 = 0.0;
          (paVar11->mOffsetMatrix).c1 = 0.0;
          (paVar11->mOffsetMatrix).c2 = 0.0;
          (paVar11->mOffsetMatrix).c3 = 1.0;
          (paVar11->mOffsetMatrix).c4 = 0.0;
          (paVar11->mOffsetMatrix).d1 = 0.0;
          (paVar11->mOffsetMatrix).d2 = 0.0;
          (paVar11->mOffsetMatrix).d3 = 0.0;
          (paVar11->mOffsetMatrix).d4 = 1.0;
        }
        else {
          calculateOffsetMatrix(this_00,paVar12,&paVar11->mOffsetMatrix);
          aiMatrix4x4t<float>::Inverse(&pMesh->mBones[uVar7]->mOffsetMatrix);
        }
        pvVar18 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  ((long)&(local_888->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish + 5);
        pLVar19 = local_880;
      }
      puVar16 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start;
      puVar13 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      if (puVar13 != puVar16) {
        uVar17 = 0;
        while (pvVar18 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         (ulong)uVar17,
              pvVar18 < (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        ((long)puVar13 - (long)puVar16 >> 2)) {
          pmVar3 = ((M3DWrapper *)pLVar19)->m3d_->vertex;
          local_888 = pvVar18;
          pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (vertexids,(size_type)pvVar18);
          uVar17 = pmVar3[*pvVar14].skinid;
          if (uVar17 >> 1 < 0x7fffffff) {
            for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
              pmVar4 = ((m3d_t *)local_880->_vptr_Logger)->skin;
              if (pmVar4[uVar17].weight[lVar6] <= 0.0) break;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_870,
                         ((m3d_t *)local_880->_vptr_Logger)->bone[pmVar4[uVar17].boneid[lVar6]].name
                         ,&local_889);
              sVar20 = local_868 & 0xffffffff;
              if ((local_868 & 0xfffffc00) != 0) {
                sVar20 = 0x3ff;
              }
              name.length = (ai_uint32)sVar20;
              memcpy(name.data,local_870,sVar20);
              name.data[sVar20] = '\0';
              std::__cxx11::string::~string((string *)&local_870);
              uVar7 = 0;
              do {
                uVar21 = uVar7;
                if (pMesh->mNumBones <= uVar21) goto LAB_004297df;
                bVar5 = aiString::operator==(&pMesh->mBones[uVar21]->mName,&name);
                uVar7 = uVar21 + 1;
              } while (!bVar5);
              puVar1 = &pMesh->mBones[uVar21]->mNumWeights;
              *puVar1 = *puVar1 + 1;
LAB_004297df:
            }
          }
          puVar16 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar13 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          pLVar19 = local_880;
          uVar17 = (int)local_888 + 1;
        }
        for (uVar7 = 0; uVar7 < pMesh->mNumBones; uVar7 = uVar7 + 1) {
          paVar11 = pMesh->mBones[uVar7];
          if ((ulong)paVar11->mNumWeights != 0) {
            uVar21 = (ulong)paVar11->mNumWeights << 3;
            __s_00 = (aiVertexWeight *)operator_new__(uVar21);
            memset(__s_00,0,uVar21);
            paVar11->mWeights = __s_00;
            paVar11->mNumWeights = 0;
          }
        }
        local_888 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
        while( true ) {
          if ((ulong)((long)(vertexids->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(vertexids->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start >> 2) <= local_888) break;
          pmVar3 = ((m3d_t *)local_880->_vptr_Logger)->vertex;
          pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (vertexids,(size_type)local_888);
          uVar17 = pmVar3[*pvVar14].skinid;
          if (uVar17 >> 1 < 0x7fffffff) {
            for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
              pmVar4 = ((m3d_t *)local_880->_vptr_Logger)->skin;
              if (pmVar4[uVar17].weight[lVar6] <= 0.0) break;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_870,
                         ((m3d_t *)local_880->_vptr_Logger)->bone[pmVar4[uVar17].boneid[lVar6]].name
                         ,&local_889);
              sVar20 = local_868 & 0xffffffff;
              if ((local_868 & 0xfffffc00) != 0) {
                sVar20 = 0x3ff;
              }
              name.length = (ai_uint32)sVar20;
              memcpy(name.data,local_870,sVar20);
              name.data[sVar20] = '\0';
              std::__cxx11::string::~string((string *)&local_870);
              uVar7 = 0;
              do {
                uVar21 = uVar7;
                if (pMesh->mNumBones <= uVar21) goto LAB_004299c4;
                bVar5 = aiString::operator==(&pMesh->mBones[uVar21]->mName,&name);
                uVar7 = uVar21 + 1;
              } while (!bVar5);
              paVar11 = pMesh->mBones[uVar21];
              paVar11->mWeights[paVar11->mNumWeights].mVertexId = (uint)local_888;
              paVar11->mWeights[paVar11->mNumWeights].mWeight =
                   ((m3d_t *)local_880->_vptr_Logger)->skin[uVar17].weight[lVar6];
              paVar11->mNumWeights = paVar11->mNumWeights + 1;
LAB_004299c4:
            }
          }
          local_888 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                      (ulong)((int)local_888 + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void M3DImporter::populateMesh(const M3DWrapper &m3d, aiMesh *pMesh, std::vector<aiFace> *faces, std::vector<aiVector3D> *vertices,
		std::vector<aiVector3D> *normals, std::vector<aiVector3D> *texcoords, std::vector<aiColor4D> *colors,
		std::vector<unsigned int> *vertexids) {

	ai_assert(pMesh != nullptr);
	ai_assert(faces != nullptr);
	ai_assert(vertices != nullptr);
	ai_assert(normals != nullptr);
	ai_assert(texcoords != nullptr);
	ai_assert(colors != nullptr);
	ai_assert(vertexids != nullptr);
	ai_assert(m3d);

	ASSIMP_LOG_DEBUG_F("M3D: populateMesh numvertices ", vertices->size(), " numfaces ", faces->size(),
			" numnormals ", normals->size(), " numtexcoord ", texcoords->size(), " numbones ", m3d->numbone);

	if (vertices->size() && faces->size()) {
		pMesh->mNumFaces = static_cast<unsigned int>(faces->size());
		pMesh->mFaces = new aiFace[pMesh->mNumFaces];
		std::copy(faces->begin(), faces->end(), pMesh->mFaces);
		pMesh->mNumVertices = static_cast<unsigned int>(vertices->size());
		pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
		std::copy(vertices->begin(), vertices->end(), pMesh->mVertices);
		if (normals->size() == vertices->size()) {
			pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
			std::copy(normals->begin(), normals->end(), pMesh->mNormals);
		}
		if (texcoords->size() == vertices->size()) {
			pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
			std::copy(texcoords->begin(), texcoords->end(), pMesh->mTextureCoords[0]);
			pMesh->mNumUVComponents[0] = 2;
		}
		if (colors->size() == vertices->size()) {
			pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
			std::copy(colors->begin(), colors->end(), pMesh->mColors[0]);
		}
		// this is complicated, because M3D stores a list of bone id / weight pairs per
		// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
		pMesh->mNumBones = m3d->numbone;
		/* we need aiBone with mOffsetMatrix for bones without weights as well */
		if (pMesh->mNumBones) {
			pMesh->mBones = new aiBone *[pMesh->mNumBones];
			for (unsigned int i = 0; i < m3d->numbone; i++) {
				aiNode *pNode;
				pMesh->mBones[i] = new aiBone;
				pMesh->mBones[i]->mName = aiString(std::string(m3d->bone[i].name));
				pMesh->mBones[i]->mNumWeights = 0;
				pNode = findNode(mScene->mRootNode, pMesh->mBones[i]->mName);
				if (pNode) {
					calculateOffsetMatrix(pNode, &pMesh->mBones[i]->mOffsetMatrix);
					pMesh->mBones[i]->mOffsetMatrix.Inverse();
				} else
					pMesh->mBones[i]->mOffsetMatrix = aiMatrix4x4();
			}
			if (vertexids->size()) {
				unsigned int i, j;
				// first count how many vertices we have per bone
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									pMesh->mBones[j]->mNumWeights++;
									break;
								}
							}
						}
					}
				}
				// allocate mWeights
				for (j = 0; j < pMesh->mNumBones; j++) {
					aiBone *pBone = pMesh->mBones[j];
					if (pBone->mNumWeights) {
						pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
						pBone->mNumWeights = 0;
					}
				}
				// fill up with data
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									aiBone *pBone = pMesh->mBones[j];
									pBone->mWeights[pBone->mNumWeights].mVertexId = i;
									pBone->mWeights[pBone->mNumWeights].mWeight = m3d->skin[s].weight[k];
									pBone->mNumWeights++;
									break;
								}
							}
						} // foreach skin
					}
				} // foreach vertexids
			}
		}
	}
}